

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O2

int xmlValidateNameValueInternal(xmlDocPtr doc,xmlChar *value)

{
  int iVar1;
  int iVar2;
  xmlChar *cur;
  long lVar3;
  uint uVar4;
  int len;
  int local_2c;
  
  if (value == (xmlChar *)0x0) {
    uVar4 = 0;
  }
  else {
    uVar4 = 0;
    iVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,value,&local_2c);
    lVar3 = (long)local_2c;
    iVar1 = xmlIsDocNameStartChar(doc,iVar1);
    if (iVar1 != 0) {
      cur = value + lVar3;
      while( true ) {
        iVar1 = xmlStringCurrentChar((xmlParserCtxtPtr)0x0,cur,&local_2c);
        lVar3 = (long)local_2c;
        iVar2 = xmlIsDocNameChar(doc,iVar1);
        if (iVar2 == 0) break;
        cur = cur + lVar3;
      }
      uVar4 = (uint)(iVar1 == 0);
    }
  }
  return uVar4;
}

Assistant:

static int
xmlValidateNameValueInternal(xmlDocPtr doc, const xmlChar *value) {
    const xmlChar *cur;
    int val, len;

    if (value == NULL) return(0);
    cur = value;
    val = xmlStringCurrentChar(NULL, cur, &len);
    cur += len;
    if (!xmlIsDocNameStartChar(doc, val))
	return(0);

    val = xmlStringCurrentChar(NULL, cur, &len);
    cur += len;
    while (xmlIsDocNameChar(doc, val)) {
	val = xmlStringCurrentChar(NULL, cur, &len);
	cur += len;
    }

    if (val != 0) return(0);

    return(1);
}